

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O2

bool google::protobuf::internal::WireFormatLite::ReadPackedEnumPreserveUnknowns
               (CodedInputStream *input,int field_number,_func_bool_int *is_valid,
               CodedOutputStream *unknown_fields_stream,RepeatedField<int> *values)

{
  bool bVar1;
  int iVar2;
  uint32 local_44;
  uint32 local_40;
  uint32 temp;
  uint32 length;
  uint32 tag;
  int value;
  
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_40);
  if (bVar1) {
    length = io::CodedInputStream::PushLimit(input,local_40);
    temp = field_number << 3;
    while( true ) {
      iVar2 = io::CodedInputStream::BytesUntilLimit(input);
      if (iVar2 < 1) break;
      bVar1 = io::CodedInputStream::ReadVarint32(input,&local_44);
      if (!bVar1) goto LAB_001748be;
      tag = local_44;
      if (is_valid == (_func_bool_int *)0x0) {
LAB_00174898:
        RepeatedField<int>::Add(values,(int *)&tag);
      }
      else {
        bVar1 = (*is_valid)(local_44);
        if (bVar1) goto LAB_00174898;
        io::CodedOutputStream::WriteVarint32(unknown_fields_stream,temp);
        io::CodedOutputStream::WriteVarint32(unknown_fields_stream,tag);
      }
    }
    io::CodedInputStream::PopLimit(input,length);
    bVar1 = true;
  }
  else {
LAB_001748be:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool WireFormatLite::ReadPackedEnumPreserveUnknowns(
    io::CodedInputStream* input, int field_number, bool (*is_valid)(int),
    io::CodedOutputStream* unknown_fields_stream, RepeatedField<int>* values) {
  uint32 length;
  if (!input->ReadVarint32(&length)) return false;
  io::CodedInputStream::Limit limit = input->PushLimit(length);
  while (input->BytesUntilLimit() > 0) {
    int value;
    if (!ReadPrimitive<int, WireFormatLite::TYPE_ENUM>(input, &value)) {
      return false;
    }
    if (is_valid == NULL || is_valid(value)) {
      values->Add(value);
    } else {
      uint32 tag = WireFormatLite::MakeTag(field_number,
                                           WireFormatLite::WIRETYPE_VARINT);
      unknown_fields_stream->WriteVarint32(tag);
      unknown_fields_stream->WriteVarint32(value);
    }
  }
  input->PopLimit(limit);
  return true;
}